

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# infback.c
# Opt level: O1

int inflateBack(z_streamp strm,in_func in,void *in_desc,out_func out,void *out_desc)

{
  byte bVar1;
  internal_state *piVar2;
  byte bVar3;
  z_streamp pzVar4;
  byte bVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  long lVar10;
  byte *pbVar11;
  ulg uVar12;
  Posf *pPVar13;
  char *pcVar14;
  undefined2 uVar15;
  ushort *puVar16;
  uint uVar17;
  ulong uVar18;
  long *plVar19;
  ulong uVar20;
  ulong uVar21;
  ushort uVar22;
  uint uVar23;
  uint uVar24;
  ulong uVar25;
  out_func p_Var26;
  uInt *table;
  uchar *__dest;
  bool bVar27;
  uchar *next;
  uint local_ac;
  byte *local_a8;
  out_func local_a0;
  in_func local_98;
  void *local_90;
  z_streamp local_88;
  uInt *local_80;
  ulong local_78;
  long *local_70;
  void *local_68;
  ct_data_s *local_60;
  uint local_54;
  Posf **local_50;
  ct_data_s *local_48;
  uint *local_40;
  uchar *local_38;
  
  if ((strm == (z_streamp)0x0) || (piVar2 = strm->state, piVar2 == (internal_state *)0x0)) {
    return -2;
  }
  strm->msg = (char *)0x0;
  *(undefined8 *)&piVar2->status = 0x3f3f;
  *(undefined4 *)&piVar2->gzindex = 0;
  local_a8 = strm->next_in;
  uVar6 = 0;
  if (local_a8 != (byte *)0x0) {
    uVar6 = strm->avail_in;
  }
  __dest = *(uchar **)&piVar2->method;
  local_ac = *(uint *)((long)&piVar2->gzhead + 4);
  local_48 = piVar2->dyn_ltree + 0x121;
  local_80 = &piVar2->hash_shift;
  local_50 = &piVar2->head;
  local_70 = &piVar2->block_start;
  local_60 = piVar2->dyn_ltree + 0x91;
  local_40 = (uint *)((long)&piVar2->head + 4);
  uVar21 = 0;
  uVar25 = 0;
  table = local_80;
  local_a0 = out;
  local_98 = in;
  local_90 = in_desc;
  local_88 = strm;
  local_68 = out_desc;
LAB_00159c0f:
  uVar24 = (uint)uVar25;
  iVar7 = piVar2->status;
  bVar5 = (byte)uVar25;
  switch(iVar7) {
  case 0x3f3f:
    if (*(int *)&piVar2->field_0xc == 0) {
      if (uVar24 < 3) {
        if ((uVar6 == 0) && (uVar6 = (*local_98)(local_90,&local_a8), uVar6 == 0)) {
LAB_0015a99b:
          local_a8 = (byte *)0x0;
          iVar7 = -5;
          uVar6 = 0;
          goto LAB_0015a9ac;
        }
        uVar24 = uVar24 | 8;
        uVar6 = uVar6 - 1;
        uVar21 = uVar21 + ((ulong)*local_a8 << (bVar5 & 0x3f));
        local_a8 = local_a8 + 1;
      }
      *(uint *)&piVar2->field_0xc = (uint)uVar21 & 1;
      switch((uint)(uVar21 >> 1) & 3) {
      case 0:
        iVar7 = 0x3f41;
        break;
      case 1:
        piVar2->window_size = (ulg)fixedtables_lenfix;
        piVar2->head = (Posf *)0x500000009;
        piVar2->prev = (Posf *)fixedtables_distfix;
        iVar7 = 0x3f48;
        break;
      case 2:
        iVar7 = 0x3f44;
        break;
      case 3:
        local_88->msg = "invalid block type";
        iVar7 = 0x3f51;
      }
      piVar2->status = iVar7;
      uVar21 = uVar21 >> 3;
      uVar25 = (ulong)(uVar24 - 3);
    }
    else {
      uVar21 = uVar21 >> (bVar5 & 7);
      uVar25 = (ulong)(uVar24 & 0xfffffff8);
      piVar2->status = 0x3f50;
    }
    goto LAB_00159c0f;
  case 0x3f41:
    uVar21 = uVar21 >> (bVar5 & 7);
    if (uVar24 < 0x20) {
      uVar18 = (ulong)(uVar24 & 0x18);
      do {
        if ((uVar6 == 0) && (uVar6 = (*local_98)(local_90,&local_a8), uVar6 == 0))
        goto LAB_0015a99b;
        uVar6 = uVar6 - 1;
        pbVar11 = local_a8 + 1;
        uVar21 = uVar21 + ((ulong)*local_a8 << ((byte)uVar18 & 0x3f));
        uVar25 = uVar18 + 8;
        bVar27 = uVar18 < 0x18;
        uVar18 = uVar25;
        local_a8 = pbVar11;
      } while (bVar27);
      uVar25 = uVar25 & 0xffffffff;
    }
    else {
      uVar25 = (ulong)(uVar24 & 0xfffffff8);
    }
    p_Var26 = local_a0;
    if ((uVar21 >> 0x10 ^ uVar21 & 0xffff) != 0xffff) {
      pcVar14 = "invalid stored block lengths";
      goto LAB_0015a6ae;
    }
    uVar24 = (uint)uVar21 & 0xffff;
    *(uint *)&piVar2->field_0x5c = uVar24;
    if ((uVar21 & 0xffff) != 0) {
      do {
        if ((uVar6 == 0) && (uVar6 = (*local_98)(local_90,&local_a8), uVar6 == 0)) {
          local_a8 = (byte *)0x0;
          uVar6 = 0;
LAB_0015aa2f:
          iVar7 = -5;
          bVar27 = false;
          goto LAB_0015a9b9;
        }
        if (local_ac == 0) {
          __dest = *(uchar **)&piVar2->method;
          local_ac = *(uint *)((long)&piVar2->gzhead + 4);
          *(uint *)&piVar2->gzindex = local_ac;
          iVar7 = (*p_Var26)(local_68,__dest,local_ac);
          if (iVar7 != 0) goto LAB_0015aa2f;
        }
        if (uVar6 <= uVar24) {
          uVar24 = uVar6;
        }
        if (local_ac <= uVar24) {
          uVar24 = local_ac;
        }
        uVar25 = (ulong)uVar24;
        memcpy(__dest,local_a8,uVar25);
        local_a8 = local_a8 + uVar25;
        uVar6 = uVar6 - uVar24;
        local_ac = local_ac - uVar24;
        __dest = __dest + uVar25;
        uVar24 = *(int *)&piVar2->field_0x5c - uVar24;
        *(uint *)&piVar2->field_0x5c = uVar24;
      } while (uVar24 != 0);
    }
    piVar2->status = 0x3f3f;
    uVar21 = 0;
    uVar25 = 0;
    table = local_80;
    goto LAB_00159c0f;
  case 0x3f44:
    break;
  case 0x3f48:
    goto switchD_00159c2f_caseD_3f48;
  default:
    if (iVar7 == 0x3f50) {
      iVar7 = 1;
      bVar27 = true;
      p_Var26 = local_a0;
      goto LAB_0015a9b9;
    }
    if (iVar7 == 0x3f51) {
      iVar7 = -3;
      goto LAB_0015a9ac;
    }
  case 0x3f40:
  case 0x3f42:
  case 0x3f43:
  case 0x3f45:
  case 0x3f46:
  case 0x3f47:
    iVar7 = -2;
LAB_0015a9ac:
    bVar27 = false;
    p_Var26 = local_a0;
LAB_0015a9b9:
    uVar24 = *(uint *)((long)&piVar2->gzhead + 4);
    uVar17 = uVar24 - local_ac;
    if (local_ac <= uVar24 && uVar17 != 0) {
      iVar8 = (*p_Var26)(local_68,*(uchar **)&piVar2->method,uVar17);
      iVar9 = -5;
      if (iVar8 == 0) {
        iVar9 = iVar7;
      }
      if (bVar27) {
        iVar7 = iVar9;
      }
    }
    local_88->next_in = local_a8;
    local_88->avail_in = uVar6;
    return iVar7;
  }
  uVar18 = uVar25;
  if (uVar24 < 0xe) {
    do {
      if ((uVar6 == 0) && (uVar6 = (*local_98)(local_90,&local_a8), uVar6 == 0)) goto LAB_0015a99b;
      uVar6 = uVar6 - 1;
      pbVar11 = local_a8 + 1;
      uVar21 = uVar21 + ((ulong)*local_a8 << ((byte)uVar18 & 0x3f));
      uVar25 = uVar18 + 8;
      bVar27 = uVar18 < 6;
      table = local_80;
      uVar18 = uVar25;
      local_a8 = pbVar11;
    } while (bVar27);
  }
  uVar24 = (uint)uVar21 & 0x1f;
  piVar2->hash_size = uVar24 + 0x101;
  uVar17 = (uint)(uVar21 >> 5) & 0x1f;
  piVar2->hash_bits = uVar17 + 1;
  piVar2->ins_h = ((uint)(uVar21 >> 10) & 0xf) + 4;
  uVar21 = uVar21 >> 0xe;
  uVar25 = (ulong)((int)uVar25 - 0xe);
  if (0x1d < uVar24 || 0x1d < uVar17) {
    pcVar14 = "too many length or distance symbols";
    goto LAB_0015a6ae;
  }
  piVar2->hash_mask = 0;
  if (piVar2->ins_h != 0) {
    do {
      uVar24 = (uint)uVar25;
      if (uVar24 < 3) {
        if ((uVar6 == 0) && (uVar6 = (*local_98)(local_90,&local_a8), uVar6 == 0))
        goto LAB_0015a99b;
        uVar24 = uVar24 | 8;
        uVar6 = uVar6 - 1;
        uVar21 = uVar21 + ((ulong)*local_a8 << ((byte)uVar25 & 0x3f));
        local_a8 = local_a8 + 1;
      }
      uVar17 = piVar2->hash_mask;
      piVar2->hash_mask = uVar17 + 1;
      *(ushort *)((long)(piVar2->dyn_ltree + -0xf) + (ulong)inflateBack::order[uVar17] * 2) =
           (ushort)uVar21 & 7;
      uVar21 = uVar21 >> 3;
      uVar25 = (ulong)(uVar24 - 3);
    } while (piVar2->hash_mask < piVar2->ins_h);
  }
  uVar18 = (ulong)piVar2->hash_mask;
  if (uVar18 < 0x13) {
    puVar16 = inflateBack::order + uVar18;
    do {
      uVar18 = uVar18 + 1;
      *(undefined2 *)((long)(piVar2->dyn_ltree + -0xf) + (ulong)*puVar16 * 2) = 0;
      puVar16 = puVar16 + 1;
    } while ((int)uVar18 != 0x13);
    piVar2->hash_mask = 0x13;
  }
  *(ct_data_s **)&piVar2->hash_shift = local_48;
  piVar2->window_size = (ulg)local_48;
  *(undefined4 *)&piVar2->head = 7;
  iVar7 = inflate_table(CODES,(unsigned_short *)local_70,0x13,(code **)table,(uint *)local_50,
                        (unsigned_short *)local_60);
  if (iVar7 != 0) {
    pcVar14 = "invalid code lengths set";
    goto LAB_0015a6ae;
  }
  piVar2->hash_mask = 0;
  if (piVar2->hash_bits + piVar2->hash_size != 0) {
    do {
      uVar18 = (ulong)(~(-1 << (*(byte *)&piVar2->head & 0x1f)) & (uint)uVar21);
      bVar5 = *(byte *)(piVar2->window_size + 1 + uVar18 * 4);
      if ((uint)uVar25 < (uint)bVar5) {
        do {
          if ((uVar6 == 0) && (uVar6 = (*local_98)(local_90,&local_a8), uVar6 == 0))
          goto LAB_0015a99b;
          uVar6 = uVar6 - 1;
          pbVar11 = local_a8 + 1;
          uVar21 = uVar21 + ((ulong)*local_a8 << ((byte)uVar25 & 0x3f));
          uVar25 = uVar25 + 8;
          uVar18 = (ulong)(~(-1 << (*(byte *)&piVar2->head & 0x1f)) & (uint)uVar21);
          bVar5 = *(byte *)(piVar2->window_size + 1 + uVar18 * 4);
          local_a8 = pbVar11;
        } while (uVar25 < bVar5);
        lVar10 = piVar2->window_size + uVar18 * 4;
      }
      else {
        lVar10 = piVar2->window_size + uVar18 * 4;
      }
      uVar17 = (uint)bVar5;
      uVar22 = *(ushort *)(lVar10 + 2);
      uVar24 = (uint)uVar25;
      if (0xf < uVar22) {
        if (uVar22 == 0x10) {
          plVar19 = local_70;
          if (uVar24 < uVar17 + 2) {
            local_78 = CONCAT71(local_78._1_7_,bVar5);
            uVar25 = uVar25 & 0xffffffff;
            do {
              if ((uVar6 == 0) &&
                 (uVar6 = (*local_98)(local_90,&local_a8), plVar19 = local_70, uVar6 == 0))
              goto LAB_0015a99b;
              pbVar11 = local_a8 + 1;
              uVar6 = uVar6 - 1;
              uVar21 = uVar21 + ((ulong)*local_a8 << ((byte)uVar25 & 0x3f));
              uVar25 = uVar25 + 8;
              local_a8 = pbVar11;
            } while (uVar25 < uVar17 + 2);
            bVar5 = (byte)local_78;
          }
          uVar21 = uVar21 >> (bVar5 & 0x3f);
          uVar17 = (int)uVar25 - uVar17;
          uVar25 = (ulong)uVar17;
          if (piVar2->hash_mask != 0) {
            uVar15 = *(undefined2 *)((long)plVar19 + (ulong)(piVar2->hash_mask - 1) * 2);
            iVar7 = ((uint)uVar21 & 3) + 3;
            uVar21 = uVar21 >> 2;
            uVar17 = uVar17 - 2;
            goto LAB_0015a2cd;
          }
        }
        else {
          if (uVar22 == 0x11) {
            if (uVar24 < uVar17 + 3) {
              local_78 = CONCAT71(local_78._1_7_,bVar5);
              uVar25 = uVar25 & 0xffffffff;
              do {
                if ((uVar6 == 0) && (uVar6 = (*local_98)(local_90,&local_a8), uVar6 == 0))
                goto LAB_0015a99b;
                pbVar11 = local_a8 + 1;
                uVar6 = uVar6 - 1;
                uVar21 = uVar21 + ((ulong)*local_a8 << ((byte)uVar25 & 0x3f));
                uVar25 = uVar25 + 8;
                local_a8 = pbVar11;
              } while (uVar25 < uVar17 + 3);
              bVar5 = (byte)local_78;
            }
            uVar21 = uVar21 >> (bVar5 & 0x3f);
            iVar7 = ((uint)uVar21 & 7) + 3;
            uVar21 = uVar21 >> 3;
            uVar17 = ((int)uVar25 - uVar17) - 3;
          }
          else {
            if (uVar24 < uVar17 + 7) {
              local_78 = CONCAT71(local_78._1_7_,bVar5);
              uVar25 = uVar25 & 0xffffffff;
              do {
                if ((uVar6 == 0) && (uVar6 = (*local_98)(local_90,&local_a8), uVar6 == 0))
                goto LAB_0015a99b;
                pbVar11 = local_a8 + 1;
                uVar6 = uVar6 - 1;
                uVar21 = uVar21 + ((ulong)*local_a8 << ((byte)uVar25 & 0x3f));
                uVar25 = uVar25 + 8;
                local_a8 = pbVar11;
              } while (uVar25 < uVar17 + 7);
              bVar5 = (byte)local_78;
            }
            uVar21 = uVar21 >> (bVar5 & 0x3f);
            iVar7 = ((uint)uVar21 & 0x7f) + 0xb;
            uVar21 = uVar21 >> 7;
            uVar17 = ((int)uVar25 - uVar17) - 7;
          }
          uVar15 = 0;
LAB_0015a2cd:
          uVar25 = (ulong)uVar17;
          if (piVar2->hash_mask + iVar7 <= piVar2->hash_bits + piVar2->hash_size) {
            uVar24 = piVar2->hash_mask;
            do {
              uVar18 = (ulong)uVar24;
              uVar24 = uVar24 + 1;
              *(undefined2 *)((long)local_70 + uVar18 * 2) = uVar15;
              iVar7 = iVar7 + -1;
            } while (iVar7 != 0);
            piVar2->hash_mask = uVar24;
            goto LAB_0015a30b;
          }
        }
        local_88->msg = "invalid bit length repeat";
        piVar2->status = 0x3f51;
        table = local_80;
        break;
      }
      uVar21 = uVar21 >> (bVar5 & 0x3f);
      uVar25 = (ulong)(uVar24 - uVar17);
      uVar24 = piVar2->hash_mask;
      piVar2->hash_mask = uVar24 + 1;
      *(ushort *)((long)(piVar2->dyn_ltree + -0xf) + (ulong)uVar24 * 2) = uVar22;
LAB_0015a30b:
      table = local_80;
    } while (piVar2->hash_mask < piVar2->hash_bits + piVar2->hash_size);
  }
  if (piVar2->status != 0x3f51) {
    if (piVar2->dyn_ltree[0x71].fc.freq == 0) {
      pcVar14 = "invalid code -- missing end-of-block";
    }
    else {
      *(ct_data_s **)&piVar2->hash_shift = local_48;
      piVar2->window_size = (ulg)local_48;
      *(undefined4 *)&piVar2->head = 9;
      iVar7 = inflate_table(LENS,(unsigned_short *)local_70,piVar2->hash_size,(code **)table,
                            (uint *)local_50,(unsigned_short *)local_60);
      if (iVar7 == 0) {
        piVar2->prev = *(Posf **)&piVar2->hash_shift;
        *(undefined4 *)((long)&piVar2->head + 4) = 6;
        iVar7 = inflate_table(DISTS,(unsigned_short *)
                                    ((long)local_70 + (ulong)piVar2->hash_size * 2),
                              piVar2->hash_bits,(code **)table,local_40,(unsigned_short *)local_60);
        if (iVar7 == 0) {
          piVar2->status = 0x3f48;
switchD_00159c2f_caseD_3f48:
          pzVar4 = local_88;
          if ((5 < uVar6) && (0x101 < local_ac)) {
            local_88->next_out = __dest;
            local_88->avail_out = local_ac;
            local_88->next_in = local_a8;
            local_88->avail_in = uVar6;
            piVar2->w_size = (int)uVar21;
            piVar2->w_bits = (int)(uVar21 >> 0x20);
            piVar2->w_mask = (uint)uVar25;
            uVar6 = *(uint *)((long)&piVar2->gzhead + 4);
            if ((uint)piVar2->gzindex < uVar6) {
              *(uint *)&piVar2->gzindex = uVar6 - local_ac;
            }
            inflate_fast(local_88,uVar6);
            local_a8 = pzVar4->next_in;
            __dest = pzVar4->next_out;
            local_ac = pzVar4->avail_out;
            uVar6 = pzVar4->avail_in;
            uVar21._0_4_ = piVar2->w_size;
            uVar21._4_4_ = piVar2->w_bits;
            uVar25 = (ulong)piVar2->w_mask;
            goto LAB_00159c0f;
          }
          uVar20 = (ulong)(~(-1 << (*(byte *)&piVar2->head & 0x1f)) & (uint)uVar21);
          bVar5 = *(byte *)(piVar2->window_size + 1 + uVar20 * 4);
          uVar18 = (ulong)bVar5;
          if ((uint)uVar25 < (uint)bVar5) {
            do {
              if ((uVar6 == 0) && (uVar6 = (*local_98)(local_90,&local_a8), uVar6 == 0))
              goto LAB_0015a99b;
              uVar6 = uVar6 - 1;
              pbVar11 = local_a8 + 1;
              uVar21 = uVar21 + ((ulong)*local_a8 << ((byte)uVar25 & 0x3f));
              uVar25 = uVar25 + 8;
              uVar20 = (ulong)(~(-1 << (*(byte *)&piVar2->head & 0x1f)) & (uint)uVar21);
              uVar18 = (ulong)*(byte *)(piVar2->window_size + 1 + uVar20 * 4);
              local_a8 = pbVar11;
            } while (uVar25 < uVar18);
            pbVar11 = (byte *)(piVar2->window_size + uVar20 * 4);
          }
          else {
            pbVar11 = (byte *)(piVar2->window_size + uVar20 * 4);
          }
          uVar17 = (uint)uVar18;
          uVar24 = (uint)uVar25;
          uVar22 = *(ushort *)(pbVar11 + 2);
          bVar5 = *pbVar11;
          if ((byte)(bVar5 - 1) < 0xf) {
            bVar3 = (byte)uVar18;
            uVar23 = ~(-1 << (bVar5 + bVar3 & 0x1f));
            uVar12 = piVar2->window_size;
            uVar20 = (ulong)((((uint)uVar21 & uVar23) >> (bVar3 & 0x1f)) + (uint)uVar22);
            bVar1 = *(byte *)(uVar12 + 1 + uVar20 * 4);
            if (uVar24 < uVar17 + bVar1) {
              uVar25 = uVar25 & 0xffffffff;
              local_78 = uVar18;
              local_38 = __dest;
              do {
                if ((uVar6 == 0) &&
                   (uVar6 = (*local_98)(local_90,&local_a8), uVar18 = local_78, __dest = local_38,
                   uVar6 == 0)) goto LAB_0015a99b;
                uVar6 = uVar6 - 1;
                pbVar11 = local_a8 + 1;
                uVar21 = uVar21 + ((ulong)*local_a8 << ((byte)uVar25 & 0x3f));
                uVar25 = uVar25 + 8;
                uVar12 = piVar2->window_size;
                uVar20 = (ulong)((((uint)uVar21 & uVar23) >> ((byte)uVar18 & 0x1f)) + (uint)uVar22);
                bVar1 = *(byte *)(uVar12 + 1 + uVar20 * 4);
                local_a8 = pbVar11;
              } while (uVar25 < (int)uVar18 + (uint)bVar1);
            }
            pbVar11 = (byte *)(uVar12 + uVar20 * 4);
            uVar21 = uVar21 >> (bVar3 & 0x3f);
            uVar22 = *(ushort *)(pbVar11 + 2);
            bVar5 = *pbVar11;
            uVar24 = (int)uVar25 - (int)uVar18;
            uVar17 = (uint)bVar1;
          }
          table = local_80;
          uVar21 = uVar21 >> ((byte)uVar17 & 0x3f);
          uVar25 = (ulong)(uVar24 - uVar17);
          *(uint *)&piVar2->field_0x5c = (uint)uVar22;
          if (bVar5 == 0) {
            if (local_ac == 0) {
              __dest = *(uchar **)&piVar2->method;
              local_ac = *(uint *)((long)&piVar2->gzhead + 4);
              *(uint *)&piVar2->gzindex = local_ac;
              iVar7 = (*local_a0)(local_68,__dest,local_ac);
              if (iVar7 != 0) {
LAB_0015aa4b:
                iVar7 = -5;
                goto LAB_0015a9ac;
              }
            }
            *__dest = piVar2->field_0x5c;
            __dest = __dest + 1;
            local_ac = local_ac - 1;
            piVar2->status = 0x3f48;
            goto LAB_00159c0f;
          }
          if ((bVar5 & 0x20) != 0) {
            piVar2->status = 0x3f3f;
            goto LAB_00159c0f;
          }
          if ((bVar5 & 0x40) == 0) {
            *(uint *)((long)&piVar2->window + 4) = bVar5 & 0xf;
            if ((bVar5 & 0xf) != 0) {
              while( true ) {
                uVar24 = *(uint *)((long)&piVar2->window + 4);
                uVar17 = (uint)uVar25;
                if (uVar24 <= uVar17) break;
                if ((uVar6 == 0) && (uVar6 = (*local_98)(local_90,&local_a8), uVar6 == 0))
                goto LAB_0015a99b;
                uVar6 = uVar6 - 1;
                uVar21 = uVar21 + ((ulong)*local_a8 << ((byte)uVar25 & 0x3f));
                uVar25 = (ulong)(uVar17 + 8);
                local_a8 = local_a8 + 1;
              }
              *(uint *)&piVar2->field_0x5c =
                   *(int *)&piVar2->field_0x5c + (~(-1 << ((byte)uVar24 & 0x1f)) & (uint)uVar21);
              uVar21 = uVar21 >> ((byte)uVar24 & 0x3f);
              uVar25 = (ulong)(uVar17 - uVar24);
            }
            uVar20 = (ulong)(~(-1 << (*(byte *)((long)&piVar2->head + 4) & 0x1f)) & (uint)uVar21);
            bVar5 = *(byte *)((long)piVar2->prev + uVar20 * 4 + 1);
            uVar18 = (ulong)bVar5;
            if ((uint)uVar25 < (uint)bVar5) {
              do {
                if ((uVar6 == 0) && (uVar6 = (*local_98)(local_90,&local_a8), uVar6 == 0))
                goto LAB_0015a99b;
                uVar6 = uVar6 - 1;
                pbVar11 = local_a8 + 1;
                uVar21 = uVar21 + ((ulong)*local_a8 << ((byte)uVar25 & 0x3f));
                uVar25 = uVar25 + 8;
                uVar20 = (ulong)(~(-1 << (*(byte *)((long)&piVar2->head + 4) & 0x1f)) & (uint)uVar21
                                );
                uVar18 = (ulong)*(byte *)((long)piVar2->prev + uVar20 * 4 + 1);
                local_a8 = pbVar11;
              } while (uVar25 < uVar18);
              pPVar13 = piVar2->prev + uVar20 * 2;
            }
            else {
              pPVar13 = piVar2->prev + uVar20 * 2;
            }
            uVar17 = (uint)uVar18;
            uVar24 = (uint)uVar25;
            uVar22 = pPVar13[1];
            bVar5 = (byte)*pPVar13;
            if (bVar5 < 0x10) {
              bVar3 = (byte)uVar18;
              uVar23 = ~(-1 << (bVar5 + bVar3 & 0x1f));
              pPVar13 = piVar2->prev;
              uVar20 = (ulong)((((uint)uVar21 & uVar23) >> (bVar3 & 0x1f)) + (uint)uVar22);
              bVar1 = *(byte *)((long)pPVar13 + uVar20 * 4 + 1);
              if (uVar24 < uVar17 + bVar1) {
                uVar25 = uVar25 & 0xffffffff;
                local_78 = uVar18;
                local_54 = uVar23;
                do {
                  if ((uVar6 == 0) &&
                     (uVar6 = (*local_98)(local_90,&local_a8), uVar18 = local_78, uVar23 = local_54,
                     uVar6 == 0)) goto LAB_0015a99b;
                  uVar6 = uVar6 - 1;
                  pbVar11 = local_a8 + 1;
                  uVar21 = uVar21 + ((ulong)*local_a8 << ((byte)uVar25 & 0x3f));
                  uVar25 = uVar25 + 8;
                  pPVar13 = piVar2->prev;
                  uVar20 = (ulong)((((uint)uVar21 & uVar23) >> ((byte)uVar18 & 0x1f)) + (uint)uVar22
                                  );
                  bVar1 = *(byte *)((long)pPVar13 + uVar20 * 4 + 1);
                  local_a8 = pbVar11;
                } while (uVar25 < (int)uVar18 + (uint)bVar1);
              }
              uVar21 = uVar21 >> (bVar3 & 0x3f);
              uVar22 = (pPVar13 + uVar20 * 2)[1];
              bVar5 = (byte)pPVar13[uVar20 * 2];
              uVar24 = (int)uVar25 - (int)uVar18;
              uVar17 = (uint)bVar1;
            }
            table = local_80;
            uVar21 = uVar21 >> ((byte)uVar17 & 0x3f);
            uVar25 = (ulong)(uVar24 - uVar17);
            if ((bVar5 & 0x40) != 0) {
              local_88->msg = "invalid distance code";
              piVar2->status = 0x3f51;
              goto LAB_00159c0f;
            }
            *(uint *)&piVar2->window = (uint)uVar22;
            *(uint *)((long)&piVar2->window + 4) = bVar5 & 0xf;
            if ((bVar5 & 0xf) != 0) {
              while( true ) {
                uVar24 = *(uint *)((long)&piVar2->window + 4);
                uVar17 = (uint)uVar25;
                if (uVar24 <= uVar17) break;
                if ((uVar6 == 0) && (uVar6 = (*local_98)(local_90,&local_a8), uVar6 == 0))
                goto LAB_0015a99b;
                uVar6 = uVar6 - 1;
                uVar21 = uVar21 + ((ulong)*local_a8 << ((byte)uVar25 & 0x3f));
                uVar25 = (ulong)(uVar17 + 8);
                local_a8 = local_a8 + 1;
              }
              *(uint *)&piVar2->window =
                   *(int *)&piVar2->window + (~(-1 << ((byte)uVar24 & 0x1f)) & (uint)uVar21);
              uVar21 = uVar21 >> ((byte)uVar24 & 0x3f);
              uVar25 = (ulong)(uVar17 - uVar24);
            }
            uVar24 = *(uint *)((long)&piVar2->gzhead + 4);
            uVar17 = 0;
            if ((uint)piVar2->gzindex < uVar24) {
              uVar17 = local_ac;
            }
            if (*(uint *)&piVar2->window <= uVar24 - uVar17) {
              do {
                if (local_ac == 0) {
                  __dest = *(uchar **)&piVar2->method;
                  local_ac = *(uint *)((long)&piVar2->gzhead + 4);
                  *(uint *)&piVar2->gzindex = local_ac;
                  iVar7 = (*local_a0)(local_68,__dest,local_ac);
                  if (iVar7 != 0) goto LAB_0015aa4b;
                }
                uVar24 = *(int *)((long)&piVar2->gzhead + 4) - *(uint *)&piVar2->window;
                uVar18 = (ulong)uVar24;
                bVar27 = local_ac <= uVar24;
                if (bVar27) {
                  uVar24 = 0;
                }
                uVar17 = *(uint *)&piVar2->field_0x5c;
                if (bVar27) {
                  uVar18 = -(ulong)*(uint *)&piVar2->window;
                }
                uVar23 = local_ac - uVar24;
                if (uVar17 <= local_ac - uVar24) {
                  uVar23 = uVar17;
                }
                *(uint *)&piVar2->field_0x5c = uVar17 - uVar23;
                uVar24 = uVar23;
                do {
                  *__dest = __dest[uVar18];
                  __dest = __dest + 1;
                  uVar24 = uVar24 - 1;
                } while (uVar24 != 0);
                local_ac = local_ac - uVar23;
              } while (*(int *)&piVar2->field_0x5c != 0);
              goto LAB_00159c0f;
            }
            pcVar14 = "invalid distance too far back";
          }
          else {
            pcVar14 = "invalid literal/length code";
          }
        }
        else {
          pcVar14 = "invalid distances set";
        }
      }
      else {
        pcVar14 = "invalid literal/lengths set";
      }
    }
LAB_0015a6ae:
    local_88->msg = pcVar14;
    piVar2->status = 0x3f51;
  }
  goto LAB_00159c0f;
}

Assistant:

int ZEXPORT inflateBack(z_streamp strm, in_func in, void FAR *in_desc,
                        out_func out, void FAR *out_desc) {
    struct inflate_state FAR *state;
    z_const unsigned char FAR *next;    /* next input */
    unsigned char FAR *put;     /* next output */
    unsigned have, left;        /* available input and output */
    unsigned long hold;         /* bit buffer */
    unsigned bits;              /* bits in bit buffer */
    unsigned copy;              /* number of stored or match bytes to copy */
    unsigned char FAR *from;    /* where to copy match bytes from */
    code here;                  /* current decoding table entry */
    code last;                  /* parent table entry */
    unsigned len;               /* length to copy for repeats, bits to drop */
    int ret;                    /* return code */
    static const unsigned short order[19] = /* permutation of code lengths */
        {16, 17, 18, 0, 8, 7, 9, 6, 10, 5, 11, 4, 12, 3, 13, 2, 14, 1, 15};

    /* Check that the strm exists and that the state was initialized */
    if (strm == Z_NULL || strm->state == Z_NULL)
        return Z_STREAM_ERROR;
    state = (struct inflate_state FAR *)strm->state;

    /* Reset the state */
    strm->msg = Z_NULL;
    state->mode = TYPE;
    state->last = 0;
    state->whave = 0;
    next = strm->next_in;
    have = next != Z_NULL ? strm->avail_in : 0;
    hold = 0;
    bits = 0;
    put = state->window;
    left = state->wsize;

    /* Inflate until end of block marked as last */
    for (;;)
        switch (state->mode) {
        case TYPE:
            /* determine and dispatch block type */
            if (state->last) {
                BYTEBITS();
                state->mode = DONE;
                break;
            }
            NEEDBITS(3);
            state->last = BITS(1);
            DROPBITS(1);
            switch (BITS(2)) {
            case 0:                             /* stored block */
                Tracev((stderr, "inflate:     stored block%s\n",
                        state->last ? " (last)" : ""));
                state->mode = STORED;
                break;
            case 1:                             /* fixed block */
                fixedtables(state);
                Tracev((stderr, "inflate:     fixed codes block%s\n",
                        state->last ? " (last)" : ""));
                state->mode = LEN;              /* decode codes */
                break;
            case 2:                             /* dynamic block */
                Tracev((stderr, "inflate:     dynamic codes block%s\n",
                        state->last ? " (last)" : ""));
                state->mode = TABLE;
                break;
            case 3:
                strm->msg = (char *)"invalid block type";
                state->mode = BAD;
            }
            DROPBITS(2);
            break;

        case STORED:
            /* get and verify stored block length */
            BYTEBITS();                         /* go to byte boundary */
            NEEDBITS(32);
            if ((hold & 0xffff) != ((hold >> 16) ^ 0xffff)) {
                strm->msg = (char *)"invalid stored block lengths";
                state->mode = BAD;
                break;
            }
            state->length = (unsigned)hold & 0xffff;
            Tracev((stderr, "inflate:       stored length %u\n",
                    state->length));
            INITBITS();

            /* copy stored block from input to output */
            while (state->length != 0) {
                copy = state->length;
                PULL();
                ROOM();
                if (copy > have) copy = have;
                if (copy > left) copy = left;
                zmemcpy(put, next, copy);
                have -= copy;
                next += copy;
                left -= copy;
                put += copy;
                state->length -= copy;
            }
            Tracev((stderr, "inflate:       stored end\n"));
            state->mode = TYPE;
            break;

        case TABLE:
            /* get dynamic table entries descriptor */
            NEEDBITS(14);
            state->nlen = BITS(5) + 257;
            DROPBITS(5);
            state->ndist = BITS(5) + 1;
            DROPBITS(5);
            state->ncode = BITS(4) + 4;
            DROPBITS(4);
#ifndef PKZIP_BUG_WORKAROUND
            if (state->nlen > 286 || state->ndist > 30) {
                strm->msg = (char *)"too many length or distance symbols";
                state->mode = BAD;
                break;
            }
#endif
            Tracev((stderr, "inflate:       table sizes ok\n"));

            /* get code length code lengths (not a typo) */
            state->have = 0;
            while (state->have < state->ncode) {
                NEEDBITS(3);
                state->lens[order[state->have++]] = (unsigned short)BITS(3);
                DROPBITS(3);
            }
            while (state->have < 19)
                state->lens[order[state->have++]] = 0;
            state->next = state->codes;
            state->lencode = (code const FAR *)(state->next);
            state->lenbits = 7;
            ret = inflate_table(CODES, state->lens, 19, &(state->next),
                                &(state->lenbits), state->work);
            if (ret) {
                strm->msg = (char *)"invalid code lengths set";
                state->mode = BAD;
                break;
            }
            Tracev((stderr, "inflate:       code lengths ok\n"));

            /* get length and distance code code lengths */
            state->have = 0;
            while (state->have < state->nlen + state->ndist) {
                for (;;) {
                    here = state->lencode[BITS(state->lenbits)];
                    if ((unsigned)(here.bits) <= bits) break;
                    PULLBYTE();
                }
                if (here.val < 16) {
                    DROPBITS(here.bits);
                    state->lens[state->have++] = here.val;
                }
                else {
                    if (here.val == 16) {
                        NEEDBITS(here.bits + 2);
                        DROPBITS(here.bits);
                        if (state->have == 0) {
                            strm->msg = (char *)"invalid bit length repeat";
                            state->mode = BAD;
                            break;
                        }
                        len = (unsigned)(state->lens[state->have - 1]);
                        copy = 3 + BITS(2);
                        DROPBITS(2);
                    }
                    else if (here.val == 17) {
                        NEEDBITS(here.bits + 3);
                        DROPBITS(here.bits);
                        len = 0;
                        copy = 3 + BITS(3);
                        DROPBITS(3);
                    }
                    else {
                        NEEDBITS(here.bits + 7);
                        DROPBITS(here.bits);
                        len = 0;
                        copy = 11 + BITS(7);
                        DROPBITS(7);
                    }
                    if (state->have + copy > state->nlen + state->ndist) {
                        strm->msg = (char *)"invalid bit length repeat";
                        state->mode = BAD;
                        break;
                    }
                    while (copy--)
                        state->lens[state->have++] = (unsigned short)len;
                }
            }

            /* handle error breaks in while */
            if (state->mode == BAD) break;

            /* check for end-of-block code (better have one) */
            if (state->lens[256] == 0) {
                strm->msg = (char *)"invalid code -- missing end-of-block";
                state->mode = BAD;
                break;
            }

            /* build code tables -- note: do not change the lenbits or distbits
               values here (9 and 6) without reading the comments in inftrees.h
               concerning the ENOUGH constants, which depend on those values */
            state->next = state->codes;
            state->lencode = (code const FAR *)(state->next);
            state->lenbits = 9;
            ret = inflate_table(LENS, state->lens, state->nlen, &(state->next),
                                &(state->lenbits), state->work);
            if (ret) {
                strm->msg = (char *)"invalid literal/lengths set";
                state->mode = BAD;
                break;
            }
            state->distcode = (code const FAR *)(state->next);
            state->distbits = 6;
            ret = inflate_table(DISTS, state->lens + state->nlen, state->ndist,
                            &(state->next), &(state->distbits), state->work);
            if (ret) {
                strm->msg = (char *)"invalid distances set";
                state->mode = BAD;
                break;
            }
            Tracev((stderr, "inflate:       codes ok\n"));
            state->mode = LEN;
                /* fallthrough */

        case LEN:
            /* use inflate_fast() if we have enough input and output */
            if (have >= 6 && left >= 258) {
                RESTORE();
                if (state->whave < state->wsize)
                    state->whave = state->wsize - left;
                inflate_fast(strm, state->wsize);
                LOAD();
                break;
            }

            /* get a literal, length, or end-of-block code */
            for (;;) {
                here = state->lencode[BITS(state->lenbits)];
                if ((unsigned)(here.bits) <= bits) break;
                PULLBYTE();
            }
            if (here.op && (here.op & 0xf0) == 0) {
                last = here;
                for (;;) {
                    here = state->lencode[last.val +
                            (BITS(last.bits + last.op) >> last.bits)];
                    if ((unsigned)(last.bits + here.bits) <= bits) break;
                    PULLBYTE();
                }
                DROPBITS(last.bits);
            }
            DROPBITS(here.bits);
            state->length = (unsigned)here.val;

            /* process literal */
            if (here.op == 0) {
                Tracevv((stderr, here.val >= 0x20 && here.val < 0x7f ?
                        "inflate:         literal '%c'\n" :
                        "inflate:         literal 0x%02x\n", here.val));
                ROOM();
                *put++ = (unsigned char)(state->length);
                left--;
                state->mode = LEN;
                break;
            }

            /* process end of block */
            if (here.op & 32) {
                Tracevv((stderr, "inflate:         end of block\n"));
                state->mode = TYPE;
                break;
            }

            /* invalid code */
            if (here.op & 64) {
                strm->msg = (char *)"invalid literal/length code";
                state->mode = BAD;
                break;
            }

            /* length code -- get extra bits, if any */
            state->extra = (unsigned)(here.op) & 15;
            if (state->extra != 0) {
                NEEDBITS(state->extra);
                state->length += BITS(state->extra);
                DROPBITS(state->extra);
            }
            Tracevv((stderr, "inflate:         length %u\n", state->length));

            /* get distance code */
            for (;;) {
                here = state->distcode[BITS(state->distbits)];
                if ((unsigned)(here.bits) <= bits) break;
                PULLBYTE();
            }
            if ((here.op & 0xf0) == 0) {
                last = here;
                for (;;) {
                    here = state->distcode[last.val +
                            (BITS(last.bits + last.op) >> last.bits)];
                    if ((unsigned)(last.bits + here.bits) <= bits) break;
                    PULLBYTE();
                }
                DROPBITS(last.bits);
            }
            DROPBITS(here.bits);
            if (here.op & 64) {
                strm->msg = (char *)"invalid distance code";
                state->mode = BAD;
                break;
            }
            state->offset = (unsigned)here.val;

            /* get distance extra bits, if any */
            state->extra = (unsigned)(here.op) & 15;
            if (state->extra != 0) {
                NEEDBITS(state->extra);
                state->offset += BITS(state->extra);
                DROPBITS(state->extra);
            }
            if (state->offset > state->wsize - (state->whave < state->wsize ?
                                                left : 0)) {
                strm->msg = (char *)"invalid distance too far back";
                state->mode = BAD;
                break;
            }
            Tracevv((stderr, "inflate:         distance %u\n", state->offset));

            /* copy match from window to output */
            do {
                ROOM();
                copy = state->wsize - state->offset;
                if (copy < left) {
                    from = put + copy;
                    copy = left - copy;
                }
                else {
                    from = put - state->offset;
                    copy = left;
                }
                if (copy > state->length) copy = state->length;
                state->length -= copy;
                left -= copy;
                do {
                    *put++ = *from++;
                } while (--copy);
            } while (state->length != 0);
            break;

        case DONE:
            /* inflate stream terminated properly */
            ret = Z_STREAM_END;
            goto inf_leave;

        case BAD:
            ret = Z_DATA_ERROR;
            goto inf_leave;

        default:
            /* can't happen, but makes compilers happy */
            ret = Z_STREAM_ERROR;
            goto inf_leave;
        }

    /* Write leftover output and return unused input */
  inf_leave:
    if (left < state->wsize) {
        if (out(out_desc, state->window, state->wsize - left) &&
            ret == Z_STREAM_END)
            ret = Z_BUF_ERROR;
    }
    strm->next_in = next;
    strm->avail_in = have;
    return ret;
}